

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IF97.h
# Opt level: O0

IF97REGIONS IF97::RegionDetermination_pX(double p,double X,IF97parameters inkey)

{
  int iVar1;
  out_of_range *poVar2;
  double dVar3;
  double dVar4;
  double Xmax;
  double Xmin;
  double Xvap;
  double Xliq;
  double Tsat;
  IF97parameters inkey_local;
  double X_local;
  double p_local;
  
  if ((RegionDetermination_pX(double,double,IF97parameters)::R1 == '\0') &&
     (iVar1 = __cxa_guard_acquire(&RegionDetermination_pX(double,double,IF97parameters)::R1),
     iVar1 != 0)) {
    Region1::Region1(&RegionDetermination_pX::R1);
    __cxa_atexit(Region1::~Region1,&RegionDetermination_pX::R1,&__dso_handle);
    __cxa_guard_release(&RegionDetermination_pX(double,double,IF97parameters)::R1);
  }
  if ((RegionDetermination_pX(double,double,IF97parameters)::R2 == '\0') &&
     (iVar1 = __cxa_guard_acquire(&RegionDetermination_pX(double,double,IF97parameters)::R2),
     iVar1 != 0)) {
    Region2::Region2(&RegionDetermination_pX::R2);
    __cxa_atexit(Region2::~Region2,&RegionDetermination_pX::R2,&__dso_handle);
    __cxa_guard_release(&RegionDetermination_pX(double,double,IF97parameters)::R2);
  }
  Xvap = 0.0;
  Xmin = 0.0;
  if ((0.000611213 <= p) && (p <= 100.0)) {
    dVar3 = BaseRegion::output(&RegionDetermination_pX::R1.super_BaseRegion,inkey,273.15,p);
    dVar4 = BaseRegion::output(&RegionDetermination_pX::R2.super_BaseRegion,inkey,1073.15,p);
    if ((X < dVar3) || (dVar4 + 1e-10 < X)) {
      if (inkey == IF97_HMASS) {
        poVar2 = (out_of_range *)__cxa_allocate_exception(0x10);
        std::out_of_range::out_of_range(poVar2,"Enthalpy out of range");
        __cxa_throw(poVar2,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
      }
      poVar2 = (out_of_range *)__cxa_allocate_exception(0x10);
      std::out_of_range::out_of_range(poVar2,"Entropy out of range");
      __cxa_throw(poVar2,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
    if (p <= 22.064) {
      dVar3 = Tsat97(p);
      Xvap = RegionOutput(inkey,dVar3,p,LIQUID);
      Xmin = RegionOutput(inkey,dVar3,p,VAPOR);
      if ((Xvap <= X) && (X <= Xmin)) {
        return REGION_4;
      }
    }
    if (16.529164252605 < p) {
      dVar3 = BaseRegion::output(&RegionDetermination_pX::R1.super_BaseRegion,inkey,623.15,p);
      if (dVar3 < X) {
        dVar3 = Region23_p(p);
        dVar3 = BaseRegion::output(&RegionDetermination_pX::R2.super_BaseRegion,inkey,dVar3,p);
        if (X < dVar3) {
          p_local._4_4_ = REGION_3;
        }
        else {
          p_local._4_4_ = REGION_2;
        }
      }
      else {
        p_local._4_4_ = REGION_1;
      }
    }
    else if (Xvap <= X) {
      if (X <= Xmin) {
        p_local._4_4_ = REGION_4;
      }
      else {
        p_local._4_4_ = REGION_2;
      }
    }
    else {
      p_local._4_4_ = REGION_1;
    }
    return p_local._4_4_;
  }
  poVar2 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(poVar2,"Pressure out of range");
  __cxa_throw(poVar2,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

inline IF97REGIONS RegionDetermination_pX(double p, double X, IF97parameters inkey){
        // Setup needed Region Equations for region determination
        static Region1 R1;
        static Region2 R2;
        // Saturation Region Limit Variables (initialized outside of the if statements below)
        double Tsat = 0;
        double Xliq = 0;
        double Xvap = 0;

        // Check overall boundary limits - Throw errors if not met
        if ((p < Pmin) || (p > Pmax))
                throw std::out_of_range("Pressure out of range");
        double Xmin = R1.output(inkey,Tmin,p);
        double Xmax = R2.output(inkey,Tmax,p);
        if (( X < Xmin ) || (X > (Xmax + 1.0E-10) )){
            if (inkey == IF97_HMASS){
                throw std::out_of_range("Enthalpy out of range");
            }
            else{
                throw std::out_of_range("Entropy out of range");
            }
        }

        if (p <= Pcrit) {  // Check saturation Dome first

            Tsat = Tsat97(p);
            Xliq = RegionOutput(inkey, Tsat, p, LIQUID);  // Makes determination between Regions 1 & 3.
            Xvap = RegionOutput(inkey, Tsat, p, VAPOR);   // Makes determination between Regions 2 & 3.

            if ((Xliq <= X) && (X <= Xvap)) {  // Within Saturation Dome (inclusive)
                return REGION_4;               //    Region 4
            }
        }
        // End Check of saturation Dome

        // Check values below min pressure on B23 line (16.529 MPa)
        if (p <= P23min) {  // p <= P23min (saturation dome)
            if (X < Xliq) {
                return REGION_1;
            } else if (X > Xvap) {
                return REGION_2;
            } else {
                return REGION_4;  // This should already be handled and returned above.
            }
        }
        // Check values above P23min
        else if (X <= R1.output(inkey, T23min, p))         // T23min is also the Temp between R1 & R3a
            return REGION_1;                               // ...otherwise R3a (fallthrough)
        else if (X >= R2.output(inkey, Region23_p(p), p))  // compare with X along B23 curve
            return REGION_2;                               // ...othersise R3b (fallthrough)
        else
            return REGION_3;                               // Return R3 since R4 has already been accounted for above.

    }